

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O1

UnicodeSet * __thiscall icu_63::UnicodeSet::complement(UnicodeSet *this,UnicodeString *s)

{
  short sVar1;
  int iVar2;
  int32_t iVar3;
  
  sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar2 = (s->fUnion).fFields.fLength;
  }
  else {
    iVar2 = (int)sVar1 >> 5;
  }
  if (((iVar2 != 0) &&
      (this->stringSpan == (UnicodeSetStringSpan *)0x0 && this->bmpSet == (BMPSet *)0x0)) &&
     ((this->fFlags & 1) == 0)) {
    iVar3 = getSingleCP(s);
    if (iVar3 < 0) {
      iVar3 = UVector::indexOf(this->strings,s,0);
      if (iVar3 < 0) {
        _add(this,s);
      }
      else {
        UVector::removeElement(this->strings,s);
      }
      if (this->pat != (char16_t *)0x0) {
        uprv_free_63(this->pat);
        this->pat = (char16_t *)0x0;
        this->patLen = 0;
      }
    }
    else {
      complement(this,iVar3,iVar3);
    }
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::complement(const UnicodeString& s) {
    if (s.length() == 0 || isFrozen() || isBogus()) return *this;
    int32_t cp = getSingleCP(s);
    if (cp < 0) {
        if (strings->contains((void*) &s)) {
            strings->removeElement((void*) &s);
        } else {
            _add(s);
        }
        releasePattern();
    } else {
        complement((UChar32)cp, (UChar32)cp);
    }
    return *this;
}